

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_walker.c
# Opt level: O0

FunctionExpression * raviX_upvalue_target_function(LuaUpvalueSymbol *symbol)

{
  LuaUpvalueSymbol *symbol_local;
  
  if (symbol->target_variable->symbol_type == SYM_ENV) {
    if (symbol->target_variable_function != (AstNode *)0x0) {
      __assert_fail("symbol->target_variable_function == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_walker.c"
                    ,0x2bf,
                    "const FunctionExpression *raviX_upvalue_target_function(const LuaUpvalueSymbol *)"
                   );
    }
    symbol_local = (LuaUpvalueSymbol *)0x0;
  }
  else {
    if (symbol->target_variable_function->type != EXPR_FUNCTION) {
      __assert_fail("symbol->target_variable_function->type == EXPR_FUNCTION",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_walker.c"
                    ,0x2c2,
                    "const FunctionExpression *raviX_upvalue_target_function(const LuaUpvalueSymbol *)"
                   );
    }
    symbol_local = (LuaUpvalueSymbol *)&symbol->target_variable_function->field_2;
  }
  return (FunctionExpression *)symbol_local;
}

Assistant:

const FunctionExpression *raviX_upvalue_target_function(const LuaUpvalueSymbol *symbol)
{
	if (symbol->target_variable->symbol_type == SYM_ENV) {
		assert(symbol->target_variable_function == NULL);
		return NULL;
	}
	assert(symbol->target_variable_function->type == EXPR_FUNCTION);
	return &symbol->target_variable_function->function_expr;
}